

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitReturn
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Return *curr)

{
  bool bVar1;
  Flow local_70;
  undefined1 local_21;
  Return *local_20;
  Return *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Flow *flow;
  
  local_21 = 0;
  local_20 = curr;
  curr_local = (Return *)this;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)__return_storage_ptr__;
  Flow::Flow(__return_storage_ptr__);
  if (local_20->value != (Expression *)0x0) {
    visit(&local_70,this,local_20->value);
    Flow::operator=(__return_storage_ptr__,&local_70);
    Flow::~Flow(&local_70);
    bVar1 = Flow::breaking(__return_storage_ptr__);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  Name::operator=(&__return_storage_ptr__->breakTo,(Name *)&RETURN_FLOW);
  return __return_storage_ptr__;
}

Assistant:

Flow visitReturn(Return* curr) {
    NOTE_ENTER("Return");
    Flow flow;
    if (curr->value) {
      flow = visit(curr->value);
      if (flow.breaking()) {
        return flow;
      }
      NOTE_EVAL1(flow.getSingleValue());
    }
    flow.breakTo = RETURN_FLOW;
    return flow;
  }